

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

ssize_t MAFSA_automaton_find(MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  
  uVar1 = 0;
  if (sz_l != 0) {
    uVar2 = *ma->ptr_nodes;
    uVar1 = 0;
    uVar3 = 0;
    do {
      uVar2 = uVar2 & 0x7fffffff;
      uVar4 = ma->ptr_links[uVar2];
      if (uVar4 == 0xff000000) {
        return 0;
      }
      uVar3 = uVar3 + 1;
      while (uVar2 = uVar2 + 1, l[uVar1] != (MAFSA_letter)(uVar4 >> 0x18)) {
        uVar4 = ma->ptr_links[uVar2];
        if (uVar4 == 0xff000000) {
          return 0;
        }
      }
      if ((uVar4 & 0xffffff) == 0) {
        return 0;
      }
      uVar2 = ma->ptr_nodes[uVar4 & 0xffffff];
      uVar1 = (ulong)uVar3;
    } while (uVar1 < sz_l);
    if (sz_l == 0) {
      uVar1 = 0;
    }
    else {
      uVar1 = (ulong)(uVar2 >> 0x1f);
    }
  }
  return uVar1;
}

Assistant:

extern ssize_t MAFSA_automaton_find(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l)
{
    uint32_t i = 0;
    uint32_t current = ma->ptr_nodes[0];
    uint32_t where = 0;

    while (i < sz_l)
    {
        MAFSA_letter label = l[i++];

        where = MAFSA_delta(ma->ptr_links, current, label);

        if (where)
        {
            current = ma->ptr_nodes[where];
        }
        else
        {
            break;
        }
    }

    if (i < sz_l) return 0;
    if (!where) return 0;
    if (!node_is_final(current)) return 0;

    return 1;
}